

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O2

void __thiscall gvr::ColoredMesh::loadPLY(ColoredMesh *this,PLYReader *ply)

{
  bool bVar1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  float _scale;
  string local_3f8;
  string local_3d8;
  allocator local_3b6;
  allocator local_3b5;
  allocator local_3b4;
  allocator local_3b3;
  allocator local_3b2;
  allocator local_3b1;
  allocator local_3b0;
  allocator local_3af;
  allocator local_3ae;
  allocator local_3ad;
  allocator local_3ac;
  allocator local_3ab;
  allocator local_3aa;
  allocator local_3a9;
  UInt8Receiver cr;
  UInt8Receiver cg;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  FloatArrayReceiver nx;
  string local_308;
  string local_2e8;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  FloatArrayReceiver ny;
  UInt8Receiver cb;
  FloatArrayReceiver vx;
  TriangleReceiver tr;
  FloatArrayReceiver vy;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar5 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY((Model *)this,ply);
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar6 = 1;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_50,"vertex",&local_3a9);
    std::__cxx11::string::string((string *)&local_70,"scan_error",&local_3aa);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_50,&local_70);
    if (pVar3 != ply_none) goto LAB_0012e70c;
    std::__cxx11::string::string((string *)&local_90,"vertex",&local_3ab);
    std::__cxx11::string::string((string *)&local_b0,"scan_conf",&local_3ac);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    uVar6 = (ulong)(pVar3 != ply_none);
    bVar7 = true;
  }
  else {
LAB_0012e70c:
    bVar7 = false;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar3 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar3 != ply_none) {
    std::__cxx11::string::string((string *)&local_d0,"vertex",&local_3ad);
    std::__cxx11::string::string((string *)&local_f0,"sy",&local_3ae);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar4 != ply_none) {
      std::__cxx11::string::string((string *)&local_110,"vertex",&local_3af);
      std::__cxx11::string::string((string *)&local_130,"sz",&local_3b0);
      PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
      bVar1 = true;
      goto LAB_0012e815;
    }
  }
  bVar1 = false;
LAB_0012e815:
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,lVar5,uVar6);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (pVar3 != ply_none) {
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if (bVar7) {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,(this->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,(this->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,(this->super_Mesh).super_PointCloud.vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,(this->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,(this->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,(this->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((this->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,(this->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,(this->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,(this->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sx",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sy",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sz",(allocator *)&cr);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&nx,(this->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&ny,(this->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&nz,(this->super_Mesh).normal,3,2);
  std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
  std::__cxx11::string::string((string *)&cg,"nx",(allocator *)&local_3f8);
  PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&nx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&cg);
  std::__cxx11::string::~string((string *)&cr);
  std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
  std::__cxx11::string::string((string *)&cg,"ny",(allocator *)&local_3f8);
  PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&ny.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&cg);
  std::__cxx11::string::~string((string *)&cr);
  std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
  std::__cxx11::string::string((string *)&cg,"nz",(allocator *)&local_3f8);
  PLYReader::setReceiver(ply,(string *)&cr,(string *)&cg,&nz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&cg);
  std::__cxx11::string::~string((string *)&cr);
  std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
  std::__cxx11::string::string((string *)&cg,"diffuse_red",(allocator *)&local_3f8);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
  std::__cxx11::string::~string((string *)&cg);
  std::__cxx11::string::~string((string *)&cr);
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
    std::__cxx11::string::string((string *)&cg,"red",(allocator *)&local_3f8);
    pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
    std::__cxx11::string::~string((string *)&cg);
    std::__cxx11::string::~string((string *)&cr);
    if (pVar2 == ply_none) {
      std::__cxx11::string::string((string *)&cr,"vertex",(allocator *)&cb);
      std::__cxx11::string::string((string *)&cg,"r",(allocator *)&local_3f8);
      pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&cr,(string *)&cg);
      std::__cxx11::string::~string((string *)&cg);
      std::__cxx11::string::~string((string *)&cr);
    }
  }
  if (pVar2 - ply_float32 < 2) {
    _scale = 255.0;
  }
  else {
    _scale = *(float *)(&DAT_0015be8c + (ulong)(pVar2 == ply_uint16) * 4);
  }
  UInt8Receiver::UInt8Receiver(&cr,this->rgb,0,_scale);
  UInt8Receiver::UInt8Receiver(&cg,this->rgb,1,_scale);
  UInt8Receiver::UInt8Receiver(&cb,this->rgb,2,_scale);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"diffuse_red",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"diffuse_green",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"diffuse_blue",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"red",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"green",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"blue",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"r",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"g",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cg.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"b",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&cb.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"face",(allocator *)&local_3d8);
  uVar6 = PLYReader::instancesOfElement(ply,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar6 & 0xffffffff);
  tr.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00173258;
  tr.p = &this->super_Mesh;
  std::__cxx11::string::string((string *)&local_3f8,"face",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"vertex_index",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_3f8,"face",(allocator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_3d8,"vertex_indices",(allocator *)&local_308);
  PLYReader::setReceiver(ply,&local_3f8,&local_3d8,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  PLYReader::readData(ply);
  std::__cxx11::string::string((string *)&local_3f8,"vertex",&local_3b1);
  std::__cxx11::string::string((string *)&local_3d8,"nx",&local_3b2);
  pVar2 = PLYReader::getTypeOfProperty(ply,&local_3f8,&local_3d8);
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  else {
    std::__cxx11::string::string((string *)&local_2e8,"vertex",&local_3b3);
    std::__cxx11::string::string((string *)&local_308,"ny",&local_3b4);
    pVar2 = PLYReader::getTypeOfProperty(ply,&local_2e8,&local_308);
    if (pVar2 == ply_none) {
      bVar7 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_150,"vertex",&local_3b5);
      std::__cxx11::string::string((string *)&local_170,"nz",&local_3b6);
      pVar2 = PLYReader::getTypeOfProperty(ply,&local_150,&local_170);
      bVar7 = pVar2 == ply_none;
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    if (!bVar7) {
      Mesh::normalizeNormals(&this->super_Mesh);
      return;
    }
  }
  Mesh::recalculateNormals(&this->super_Mesh);
  return;
}

Assistant:

void ColoredMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}